

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::TSMuxer(TSMuxer *this,MuxerManager *owner)

{
  _Rb_tree_header *p_Var1;
  ulong local_50 [4];
  
  AbstractMuxer::AbstractMuxer(&this->super_AbstractMuxer,owner);
  (this->super_AbstractMuxer)._vptr_AbstractMuxer = (_func_int **)&PTR__TSMuxer_0024c678;
  (this->m_m2tsDelayBlocks).
  super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_m2tsDelayBlocks).
  super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_m2tsDelayBlocks).
  super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_extIndexToTSIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_extIndexToTSIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->m_extIndexToTSIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->m_extIndexToTSIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_extIndexToTSIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_extIndexToTSIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header;
  (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  TS_program_map_section::TS_program_map_section(&this->m_pmt);
  TS_program_association_section::TS_program_association_section(&this->m_pat);
  p_Var1 = &(this->m_pesType)._M_t._M_impl.super__Rb_tree_header;
  (this->m_pesType)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_pesType)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_pesType)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_pesType)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_pesType)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pesData).m_size = 0;
  (this->m_muxedPacketCnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_muxedPacketCnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_muxedPacketCnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outFileName)._M_dataplus._M_p = (pointer)&(this->m_outFileName).field_2;
  (this->m_outFileName)._M_string_length = 0;
  (this->m_outFileName).field_2._M_local_buf[0] = '\0';
  (this->m_interleaveInfo).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_interleaveInfo).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_interleaveInfo).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_priorityData).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_priorityData).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_priorityData).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_m2tsMode = false;
  this->m_vbvLen = 45000;
  this->m_lastPESDTS = -1;
  this->m_cbrBitrate = -1;
  this->m_minBitrate = -1;
  this->m_pcrOnVideo = true;
  this->m_endStreamDTS = 0;
  this->m_prevM2TSPCROffset = 0;
  this->m_pesPID = 0;
  this->m_lastTSIndex = -1;
  this->m_lastPesLen = -1;
  this->m_lastMuxedDts = -1;
  this->m_lastPCR = -1;
  this->m_lastPMTPCR = -1;
  this->m_lastSITPCR = -1;
  this->m_needTruncate = false;
  this->m_beforePCRDataWrited = false;
  this->m_useNewStyleAudioPES = false;
  this->m_secondaryAudioTrackCnt = 0;
  this->m_pgsTrackCnt = 0;
  this->m_videoTrackCnt = 0;
  this->m_DVvideoTrackCnt = 0;
  this->m_videoSecondTrackCnt = 0;
  this->m_audioTrackCnt = 0;
  this->m_nullCnt = 0;
  this->m_pmtCnt = 0;
  this->m_patCnt = 0;
  this->m_sitCnt = 0;
  this->m_minDts = -1;
  this->m_pcrBits = 0;
  this->m_pcr_delta = -1;
  this->m_patPmtDelta = -1;
  local_50[0] = 0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::emplace_back<long>(&this->m_firstPts,(long *)local_50);
  local_50[0] = 0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::emplace_back<long>(&this->m_lastPts,(long *)local_50);
  local_50[0] = local_50[0] & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->m_muxedPacketCnt,(uint *)local_50);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::emplace_back<>(&this->m_interleaveInfo);
  this->m_pesIFrame = false;
  this->m_pesSpsPps = false;
  this->m_computeMuxStats = false;
  this->m_splitSize = 0;
  this->m_splitDuration = 0;
  this->m_curFileNum = 0;
  this->m_bluRayMode = false;
  this->m_hdmvDescriptors = true;
  this->m_pmtFrames = 0;
  this->m_curFileStartPts = 0;
  this->m_lastGopNullCnt = 0;
  this->m_outBufLen = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->m_pesData).m_data,0x20000);
  this->m_mainStreamIndex = -1;
  this->m_muxFile = (AbstractOutputStream *)0x0;
  this->m_isExternalFile = false;
  this->m_writeBlockSize = 0;
  this->m_frameSize = 0xbc;
  this->m_outBuf = (uint8_t *)0x0;
  this->m_masterMode = false;
  this->m_subMode = false;
  this->m_timeOffset = 0;
  this->m_processedBlockSize = 0;
  this->m_sublingMuxer = (TSMuxer *)0x0;
  this->m_fixed_pcr_offset = -45000;
  this->m_prevM2TSPCR = -13500000;
  this->m_canSwithBlock = true;
  this->m_additionCLPISize = 0;
  return;
}

Assistant:

TSMuxer::TSMuxer(MuxerManager* owner) : AbstractMuxer(owner)
{
    m_m2tsMode = false;
    m_vbvLen = DEFAULT_VBV_BUFFER_LEN * 90;
    m_lastPESDTS = -1;
    m_cbrBitrate = -1;  // mux CBR if bitrate specifed
    m_minBitrate = -1;
    m_pcrOnVideo = true;
    m_endStreamDTS = 0;
    m_prevM2TSPCROffset = 0;
    m_pesPID = 0;
    m_lastTSIndex = -1;
    m_lastPesLen = -1;
    m_lastMuxedDts = -1;
    m_lastPCR = -1;
    m_lastPMTPCR = -1;
    m_lastSITPCR = -1;
    m_nullCnt = 0;
    m_pmtCnt = 0;
    m_patCnt = 0;
    m_sitCnt = 0;
    m_needTruncate = false;
    m_videoTrackCnt = 0;
    m_DVvideoTrackCnt = 0;
    m_videoSecondTrackCnt = 0;
    m_audioTrackCnt = 0;
    m_secondaryAudioTrackCnt = 0;
    m_pgsTrackCnt = 0;
    m_beforePCRDataWrited = false;
    m_useNewStyleAudioPES = false;
    m_minDts = -1;
    m_pcrBits = 0;
    m_pcr_delta = -1;
    m_patPmtDelta = -1;
    m_firstPts.push_back(-1);
    m_lastPts.push_back(-1);
    m_muxedPacketCnt.push_back(0);
    m_interleaveInfo.emplace_back();
    m_pesIFrame = false;
    m_pesSpsPps = false;
    m_computeMuxStats = false;
    m_pmtFrames = 0;
    m_curFileStartPts = 0;  // FIXED_PTS_OFFSET;
    m_splitSize = 0;
    m_splitDuration = 0;
    m_curFileNum = 0;
    m_bluRayMode = false;
    m_hdmvDescriptors = true;
    m_lastGopNullCnt = 0;
    m_outBufLen = 0;
    m_pesData.reserve(1024 * 128);
    m_mainStreamIndex = -1;
    m_muxFile = nullptr;
    m_isExternalFile = false;
    m_writeBlockSize = 0;
    m_frameSize = 188;

    m_processedBlockSize = 0;
    m_sublingMuxer = nullptr;
    m_outBuf = nullptr;
    m_masterMode = false;
    m_subMode = false;
    setPtsOffset(0);
    m_canSwithBlock = true;
    m_additionCLPISize = 0;
#ifdef _DEBUG
    m_lastProcessedDts = -1000000000;
    m_lastStreamIndex = -1;
#endif
}